

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O0

void __thiscall glTF2::Object::~Object(Object *this)

{
  Object *this_local;
  
  this->_vptr_Object = (_func_int **)&PTR_IsSpecial_00ed94e8;
  std::__cxx11::string::~string((string *)&this->name);
  std::__cxx11::string::~string((string *)&this->id);
  return;
}

Assistant:

virtual ~Object() {}